

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O3

void __thiscall flow::BasicBlock::unlinkSuccessor(BasicBlock *this,BasicBlock *successor)

{
  BasicBlock **ppBVar1;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  _Var2;
  BasicBlock **ppBVar3;
  BasicBlock *local_20;
  BasicBlock *local_18;
  
  local_20 = successor;
  if (successor == (BasicBlock *)0x0) {
    __assert_fail("successor != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xd9,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  local_18 = this;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::BasicBlock*const>>
                    ((successor->predecessors_).
                     super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (successor->predecessors_).
                     super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  ppBVar3 = (successor->predecessors_).
            super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (_Var2._M_current != ppBVar3) {
    ppBVar1 = _Var2._M_current + 1;
    if (ppBVar1 != ppBVar3) {
      memmove(_Var2._M_current,ppBVar1,(long)ppBVar3 - (long)ppBVar1);
      ppBVar3 = (successor->predecessors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    (successor->predecessors_).
    super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar3 + -1;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::BasicBlock*const>>
                      ((this->successors_).
                       super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->successors_).
                       super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_20);
    ppBVar3 = (this->successors_).
              super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (_Var2._M_current != ppBVar3) {
      ppBVar1 = _Var2._M_current + 1;
      if (ppBVar1 != ppBVar3) {
        memmove(_Var2._M_current,ppBVar1,(long)ppBVar3 - (long)ppBVar1);
        ppBVar3 = (this->successors_).
                  super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (this->successors_).
      super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar3 + -1;
      return;
    }
    __assert_fail("s != successors_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xe1,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  __assert_fail("p != successor->predecessors_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,0xdd,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
}

Assistant:

void BasicBlock::unlinkSuccessor(BasicBlock* successor) {
  assert(successor != nullptr);

  auto p = std::find(successor->predecessors_.begin(),
                     successor->predecessors_.end(), this);
  assert(p != successor->predecessors_.end());
  successor->predecessors_.erase(p);

  auto s = std::find(successors_.begin(), successors_.end(), successor);
  assert(s != successors_.end());
  successors_.erase(s);
}